

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte type1;
  ushort key;
  uint8_t type;
  byte type2_00;
  _Bool _Var1;
  int iVar2;
  shared_container_t *psVar3;
  container_t *c;
  ushort *puVar4;
  shared_container_t *container;
  bitset_container_t *src_2;
  ushort uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint8_t result_type;
  uint8_t type2;
  uint local_54;
  roaring_array_t *local_50;
  shared_container_t *local_48;
  ulong local_40;
  ulong local_38;
  
  result_type = '\0';
  local_54 = (x2->high_low_container).size;
  if (local_54 == 0) {
    return;
  }
  uVar10 = (x1->high_low_container).size;
  uVar6 = (ulong)uVar10;
  if (uVar10 == 0) {
    roaring_bitmap_overwrite(x1,x2);
    return;
  }
  uVar5 = *(x1->high_low_container).keys;
  puVar4 = (x2->high_low_container).keys;
  uVar8 = 0;
  uVar11 = 0;
  local_50 = &x2->high_low_container;
LAB_001043aa:
  do {
    uVar10 = (uint)uVar11;
    key = *puVar4;
    uVar8 = (ulong)(int)uVar8;
    uVar9 = (int)uVar6 - 1;
    while( true ) {
      uVar7 = (uint)uVar8;
      if (uVar5 == key) break;
      if (key <= uVar5) {
        type2 = local_50->typecodes[uVar11 & 0xffff];
        c = get_copy_of_container
                      (local_50->containers[uVar11 & 0xffff],&type2,(_Bool)(local_50->flags & 1));
        if ((local_50->flags & 1) != 0) {
          local_50->containers[(int)uVar10] = c;
          local_50->typecodes[(int)uVar10] = type2;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,uVar7,key,c,type2);
        uVar6 = (ulong)((int)uVar6 + 1);
        uVar10 = uVar10 + 1;
        uVar11 = (ulong)uVar10;
        if (uVar10 == local_54) {
          uVar7 = uVar7 + 1;
          uVar10 = local_54;
          goto LAB_001045e0;
        }
        uVar8 = uVar8 + 1;
        puVar4 = (ushort *)((ulong)((uVar10 & 0xffff) * 2) + (long)local_50->keys);
        goto LAB_001043aa;
      }
      if (uVar9 == uVar7) goto LAB_001045e5;
      uVar8 = uVar8 + 1;
      uVar5 = (x1->high_low_container).keys[uVar8 & 0xffff];
    }
    type1 = (x1->high_low_container).typecodes[uVar8 & 0xffff];
    container = (shared_container_t *)(x1->high_low_container).containers[uVar8 & 0xffff];
    type2 = local_50->typecodes[uVar11 & 0xffff];
    src_2 = (bitset_container_t *)local_50->containers[uVar11 & 0xffff];
    local_38 = uVar6;
    if (type1 == 4) {
      psVar3 = (shared_container_t *)container_lazy_xor(container,'\x04',src_2,type2,&result_type);
      shared_container_free(container);
      container = psVar3;
    }
    else {
      type2_00 = type2;
      if (type2 == 4) {
        type2_00 = *(byte *)&src_2->words;
        src_2 = *(bitset_container_t **)src_2;
      }
      if ((uint)type2_00 + (uint)type1 * 4 == 5) {
        bitset_container_xor_nocard
                  ((bitset_container_t *)container,src_2,(bitset_container_t *)container);
        result_type = '\x01';
      }
      else {
        if ((type1 == 1) && (*(int *)&container->container == -1)) {
          local_48 = container;
          local_40 = (ulong)type2_00;
          iVar2 = bitset_container_compute_cardinality((bitset_container_t *)container);
          type2_00 = (byte)local_40;
          *(int *)&local_48->container = iVar2;
          container = local_48;
        }
        container = (shared_container_t *)
                    container_ixor(container,type1,src_2,type2_00,&result_type);
      }
    }
    type = result_type;
    local_48 = container;
    _Var1 = container_nonzero_cardinality(container,result_type);
    if (_Var1) {
      (x1->high_low_container).containers[uVar8] = local_48;
      (x1->high_low_container).typecodes[uVar8] = type;
      uVar8 = (ulong)(uVar7 + 1);
      uVar6 = local_38;
    }
    else {
      container_free(local_48,type);
      ra_remove_at_index(&x1->high_low_container,uVar7);
      uVar6 = (ulong)uVar9;
    }
    uVar10 = uVar10 + 1;
    uVar11 = (ulong)uVar10;
    uVar7 = (uint)uVar8;
    if ((uVar7 == (uint)uVar6) || (uVar10 == local_54)) {
LAB_001045e0:
      if (uVar7 != (uint)uVar6) {
        return;
      }
LAB_001045e5:
      ra_append_copy_range
                (&x1->high_low_container,local_50,uVar10,local_54,(_Bool)(local_50->flags & 1));
      return;
    }
    uVar5 = (x1->high_low_container).keys[uVar7 & 0xffff];
    puVar4 = (ushort *)((ulong)((uVar10 & 0xffff) * 2) + (long)local_50->keys);
  } while( true );
}

Assistant:

void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    assert(x1 != x2);
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_lazy_xor(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            } else {
                c = container_lazy_ixor(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
                ++pos1;
            } else {
                container_free(c, result_type);
                ra_remove_at_index(&x1->high_low_container, pos1);
                --length1;
            }
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}